

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treeep.cpp
# Opt level: O2

double __thiscall libDAI::TreeEP::run(TreeEP *this)

{
  map<unsigned_long,_libDAI::TreeEP::TreeEPSubTree,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_libDAI::TreeEP::TreeEPSubTree>_>_>
  *this_00;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *Qa;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *Qb;
  _func_int *p_Var1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  ostream *poVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar5;
  undefined4 extraout_var_02;
  size_type __n;
  undefined4 extraout_var_03;
  ulong uVar6;
  undefined4 extraout_var_04;
  undefined8 uVar7;
  undefined4 extraout_var_05;
  pointer pVVar8;
  mapped_type *pmVar9;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  size_t i;
  ulong uVar10;
  pointer pVVar11;
  double dVar12;
  Real x;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> old_beliefs;
  Diffs diffs;
  Factor nb;
  
  iVar3 = (*(this->super_JTree).super_DAIAlgRG.super_InferenceAlgorithm._vptr_InferenceAlgorithm[6])
                    ();
  if (CONCAT44(extraout_var,iVar3) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Starting ");
    (*(this->super_JTree).super_DAIAlgRG.super_InferenceAlgorithm._vptr_InferenceAlgorithm[9])
              (&diffs,this);
    poVar4 = std::operator<<(poVar4,(string *)&diffs);
    std::operator<<(poVar4,"...");
    std::__cxx11::string::~string((string *)&diffs);
  }
  iVar3 = (*(this->super_JTree).super_DAIAlgRG.super_InferenceAlgorithm._vptr_InferenceAlgorithm[6])
                    (this);
  if (2 < CONCAT44(extraout_var_00,iVar3)) {
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  toc();
  iVar3 = (*(this->super_JTree).super_DAIAlgRG.super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                    (this);
  lVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar3) + 0x28))
                    ((long *)CONCAT44(extraout_var_01,iVar3));
  Diffs::Diffs(&diffs,lVar5,1.0);
  old_beliefs.super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  old_beliefs.super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  old_beliefs.super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar3 = (*(this->super_JTree).super_DAIAlgRG.super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                    (this);
  __n = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar3) + 0x28))
                  ((long *)CONCAT44(extraout_var_02,iVar3));
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::reserve
            (&old_beliefs,__n);
  uVar10 = 0;
  while( true ) {
    iVar3 = (*(this->super_JTree).super_DAIAlgRG.super_InferenceAlgorithm._vptr_InferenceAlgorithm
              [5])(this);
    uVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar3) + 0x28))
                      ((long *)CONCAT44(extraout_var_03,iVar3));
    if (uVar6 <= uVar10) break;
    iVar3 = (*(this->super_JTree).super_DAIAlgRG.super_InferenceAlgorithm._vptr_InferenceAlgorithm
              [5])(this);
    uVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar3) + 0x30))
                      ((long *)CONCAT44(extraout_var_04,iVar3),uVar10);
    (*(this->super_JTree).super_DAIAlgRG.super_InferenceAlgorithm._vptr_InferenceAlgorithm[10])
              (&nb,this,uVar7);
    std::vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>>::
    emplace_back<libDAI::TFactor<double>>
              ((vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>> *)
               &old_beliefs,&nb);
    TFactor<double>::~TFactor(&nb);
    uVar10 = uVar10 + 1;
  }
  this_00 = &this->_Q;
  Qa = &(this->super_JTree)._Qa;
  Qb = &(this->super_JTree)._Qb;
  uVar10 = 0;
  while (this->_iterations = uVar10, uVar10 < (this->Props2).maxiter) {
    dVar12 = Diffs::max(&diffs);
    if (dVar12 <= (this->Props2).tol) break;
    pVVar11 = (pointer)0x0;
    while( true ) {
      nb._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
      super__Vector_impl_data._M_start = pVVar11;
      iVar3 = (*(this->super_JTree).super_DAIAlgRG.super_InferenceAlgorithm._vptr_InferenceAlgorithm
                [5])(this);
      pVVar8 = (pointer)(**(code **)(*(long *)CONCAT44(extraout_var_05,iVar3) + 0x48))
                                  ((long *)CONCAT44(extraout_var_05,iVar3));
      if (pVVar8 <= pVVar11) break;
      bVar2 = offtree(this,(size_t)nb._vs._vars.
                                   super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                   _M_impl.super__Vector_impl_data._M_start);
      if (bVar2) {
        pmVar9 = std::
                 map<unsigned_long,_libDAI::TreeEP::TreeEPSubTree,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_libDAI::TreeEP::TreeEPSubTree>_>_>
                 ::operator[](this_00,(key_type *)&nb);
        TreeEPSubTree::InvertAndMultiply(pmVar9,Qa,Qb);
        pmVar9 = std::
                 map<unsigned_long,_libDAI::TreeEP::TreeEPSubTree,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_libDAI::TreeEP::TreeEPSubTree>_>_>
                 ::operator[](this_00,(key_type *)&nb);
        TreeEPSubTree::HUGIN_with_I(pmVar9,Qa,Qb);
        pmVar9 = std::
                 map<unsigned_long,_libDAI::TreeEP::TreeEPSubTree,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_libDAI::TreeEP::TreeEPSubTree>_>_>
                 ::operator[](this_00,(key_type *)&nb);
        TreeEPSubTree::InvertAndMultiply(pmVar9,Qa,Qb);
      }
      pVVar11 = (pointer)((long)&(nb._vs._vars.
                                  super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->_label + 1);
    }
    lVar5 = 0;
    uVar10 = 0;
    while( true ) {
      iVar3 = (*(this->super_JTree).super_DAIAlgRG.super_InferenceAlgorithm._vptr_InferenceAlgorithm
                [5])(this);
      uVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar3) + 0x28))
                        ((long *)CONCAT44(extraout_var_06,iVar3));
      if (uVar6 <= uVar10) break;
      iVar3 = (*(this->super_JTree).super_DAIAlgRG.super_InferenceAlgorithm._vptr_InferenceAlgorithm
                [5])(this);
      uVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_07,iVar3) + 0x30))
                        ((long *)CONCAT44(extraout_var_07,iVar3),uVar10);
      (*(this->super_JTree).super_DAIAlgRG.super_InferenceAlgorithm._vptr_InferenceAlgorithm[10])
                (&nb,this,uVar7);
      x = dist(&nb,(TFactor<double> *)
                   ((long)&((old_beliefs.
                             super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_vs)._vars.
                           super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar5),DISTLINF);
      Diffs::push(&diffs,x);
      TFactor<double>::operator=
                ((TFactor<double> *)
                 ((long)&((old_beliefs.
                           super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_vs)._vars.
                         super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar5),&nb);
      TFactor<double>::~TFactor(&nb);
      uVar10 = uVar10 + 1;
      lVar5 = lVar5 + 0x38;
    }
    iVar3 = (*(this->super_JTree).super_DAIAlgRG.super_InferenceAlgorithm._vptr_InferenceAlgorithm
              [6])(this);
    if (2 < CONCAT44(extraout_var_08,iVar3)) {
      std::operator<<((ostream *)&std::cout,"TreeEP::run:  maxdiff ");
      dVar12 = Diffs::max(&diffs);
      poVar4 = std::ostream::_M_insert<double>(dVar12);
      poVar4 = std::operator<<(poVar4," after ");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      poVar4 = std::operator<<(poVar4," passes");
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    uVar10 = this->_iterations + 1;
  }
  dVar12 = Diffs::max(&diffs);
  if (this->_maxdiff < dVar12) {
    dVar12 = Diffs::max(&diffs);
    this->_maxdiff = dVar12;
  }
  iVar3 = (*(this->super_JTree).super_DAIAlgRG.super_InferenceAlgorithm._vptr_InferenceAlgorithm[6])
                    (this);
  if (CONCAT44(extraout_var_09,iVar3) != 0) {
    dVar12 = Diffs::max(&diffs);
    p_Var1 = (this->super_JTree).super_DAIAlgRG.super_InferenceAlgorithm._vptr_InferenceAlgorithm[6]
    ;
    if (dVar12 <= (this->Props2).tol) {
      iVar3 = (*p_Var1)(this);
      if (2 < CONCAT44(extraout_var_11,iVar3)) {
        std::operator<<((ostream *)&std::cout,"TreeEP::run:  ");
      }
      poVar4 = std::operator<<((ostream *)&std::cout,"converged in ");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      poVar4 = std::operator<<(poVar4," passes (");
      toc();
      poVar4 = std::ostream::_M_insert<long>((long)poVar4);
      poVar4 = std::operator<<(poVar4," clocks).");
    }
    else {
      iVar3 = (*p_Var1)(this);
      if (CONCAT44(extraout_var_10,iVar3) == 1) {
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      }
      poVar4 = std::operator<<((ostream *)&std::cout,"TreeEP::run:  WARNING: not converged within ")
      ;
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      poVar4 = std::operator<<(poVar4," passes (");
      toc();
      poVar4 = std::ostream::_M_insert<long>((long)poVar4);
      std::operator<<(poVar4," clocks)...final maxdiff:");
      dVar12 = Diffs::max(&diffs);
      poVar4 = std::ostream::_M_insert<double>(dVar12);
    }
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  dVar12 = Diffs::max(&diffs);
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::~vector
            (&old_beliefs);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&diffs);
  return dVar12;
}

Assistant:

double TreeEP::run() {
        if( Verbose() >= 1 )
            cout << "Starting " << identify() << "...";
        if( Verbose() >= 3)
            cout << endl;

        clock_t tic = toc();
        Diffs diffs(grm().nrVars(), 1.0);

        vector<Factor> old_beliefs;
        old_beliefs.reserve( grm().nrVars() );
        for( size_t i = 0; i < grm().nrVars(); i++ )
            old_beliefs.push_back(belief(grm().var(i)));

        // do several passes over the network until maximum number of iterations has
        // been reached or until the maximum belief difference is smaller than tolerance
        for( _iterations = 0; _iterations < Props2.maxiter && diffs.max() > Props2.tol; _iterations++ ) {
            for( size_t I = 0; I < grm().nrFactors(); I++ )
                if( offtree(I) ) {  
                    _Q[I].InvertAndMultiply( _Qa, _Qb );
                    _Q[I].HUGIN_with_I( _Qa, _Qb );
                    _Q[I].InvertAndMultiply( _Qa, _Qb );
                }

            // calculate new beliefs and compare with old ones
            for( size_t i = 0; i < grm().nrVars(); i++ ) {
                Factor nb( belief(grm().var(i)) );
                diffs.push( dist( nb, old_beliefs[i], Prob::DISTLINF ) );
                old_beliefs[i] = nb;
            }

            if( Verbose() >= 3 )
                cout << "TreeEP::run:  maxdiff " << diffs.max() << " after " << _iterations+1 << " passes" << endl;
        }

        if( diffs.max() > _maxdiff )
            _maxdiff = diffs.max();

        if( Verbose() >= 1 ) {
            if( diffs.max() > Props2.tol ) {
                if( Verbose() == 1 )
                    cout << endl;
                cout << "TreeEP::run:  WARNING: not converged within " << Props2.maxiter << " passes (" << toc() - tic << " clocks)...final maxdiff:" << diffs.max() << endl;
            } else {
                if( Verbose() >= 3 )
                    cout << "TreeEP::run:  ";
                cout << "converged in " << _iterations << " passes (" << toc() - tic << " clocks)." << endl;
            }
        }

        return diffs.max();
    }